

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdump.cpp
# Opt level: O0

void mmdump(int f,uint64_t offset,uint64_t length,uint64_t step,uint64_t width,int access,
           int mmapmode)

{
  uint64_t uVar1;
  size_type __n;
  uint8_t *puVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  allocator<unsigned_long> local_121;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_120;
  allocator<unsigned_int> local_101;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  allocator<unsigned_short> local_e1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_e0;
  allocator<unsigned_char> local_c1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  int local_a4;
  uint8_t *local_a0;
  unsigned_long local_98;
  uint64_t want;
  uint8_t *p;
  allocator<unsigned_char> local_71;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  mappedmem m;
  uint64_t uStack_30;
  int access_local;
  uint64_t width_local;
  uint64_t step_local;
  uint64_t length_local;
  uint64_t offset_local;
  int f_local;
  
  uStack_30 = width;
  width_local = step;
  step_local = length;
  length_local = offset;
  offset_local._4_4_ = f;
  mappedmem::mappedmem
            ((mappedmem *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,f,offset,offset + length,mmapmode);
  __n = uStack_30;
  std::allocator<unsigned_char>::allocator(&local_71);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,__n,&local_71);
  std::allocator<unsigned_char>::~allocator(&local_71);
  want = (uint64_t)
         mappedmem::data((mappedmem *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = want;
    puVar2 = mappedmem::data((mappedmem *)
                             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (puVar2 + step_local <= uVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      mappedmem::~mappedmem
                ((mappedmem *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    local_a0 = mappedmem::data((mappedmem *)
                               &data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a0 = local_a0 + (step_local - want);
    puVar3 = std::min<unsigned_long>((unsigned_long *)&local_a0,&stack0xffffffffffffffd0);
    local_98 = *puVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    copydata(pvVar4,(uint8_t *)want,(int)local_98,access);
    if (local_98 < uStack_30) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,local_98
                         );
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                          uStack_30);
      local_a4 = 0;
      std::fill<unsigned_char*,int>(pvVar4,pvVar5,&local_a4);
    }
    switch(access) {
    case 1:
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      uVar6 = uStack_30 / (ulong)(long)access;
      std::allocator<unsigned_char>::allocator(&local_c1);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c0,pvVar4,
                 pvVar5 + uVar6,&local_c1);
      print<unsigned_long&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ("%08llx: %b",&length_local,&local_c0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c0);
      std::allocator<unsigned_char>::~allocator(&local_c1);
    case 2:
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      uVar6 = uStack_30 / (ulong)(long)access;
      std::allocator<unsigned_short>::allocator(&local_e1);
      std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_char*,void>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_e0,pvVar4,
                 pvVar5 + uVar6,&local_e1);
      print<unsigned_long&,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                ("%08llx: %b",&length_local,&local_e0);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_e0);
      std::allocator<unsigned_short>::~allocator(&local_e1);
    case 4:
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      uVar6 = uStack_30 / (ulong)(long)access;
      std::allocator<unsigned_int>::allocator(&local_101);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_char*,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_100,pvVar4,
                 pvVar5 + uVar6,&local_101);
      print<unsigned_long&,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ("%08llx: %b",&length_local,&local_100);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
      std::allocator<unsigned_int>::~allocator(&local_101);
    case 8:
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      uVar6 = uStack_30 / (ulong)(long)access;
      std::allocator<unsigned_long>::allocator(&local_121);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_char*,void>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_120,pvVar4,
                 pvVar5 + uVar6,&local_121);
      print<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ("%08llx: %b",&length_local,&local_120);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_120);
      std::allocator<unsigned_long>::~allocator(&local_121);
    default:
      length_local = width_local + length_local;
      want = width_local + want;
    }
  } while( true );
}

Assistant:

void mmdump(int f, uint64_t offset, uint64_t length, uint64_t step, uint64_t width, int access, int mmapmode)
{
    mappedmem m(f, offset, offset+length, mmapmode);

    std::vector<uint8_t> data(width);
    for (uint8_t *p= m.data() ; p<m.data()+length ; p+=step)
    {
        uint64_t want= std::min((uint64_t)(m.data()+length-p), width);
        copydata(&data[0], p, want, access);
        if (want<width)
            std::fill(&data[want], &data[width], 0);
        switch(access)
        {
        case 1: print("%08llx: %b", offset, std::vector<uint8_t>(&data[0], &data[0]+width/access));
        case 2: print("%08llx: %b", offset, std::vector<uint16_t>(&data[0], &data[0]+width/access));
        case 4: print("%08llx: %b", offset, std::vector<uint32_t>(&data[0], &data[0]+width/access));
        case 8: print("%08llx: %b", offset, std::vector<uint64_t>(&data[0], &data[0]+width/access));
        }

        offset += step;
    }
}